

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImFontGlyph *pIVar11;
  ImFontGlyph *pIVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  
  uVar15 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar15 == 0) {
    uVar17 = 1;
  }
  else {
    lVar13 = 0;
    uVar17 = 0;
    do {
      uVar16 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar13) >> 2;
      if (uVar16 < uVar17) {
        uVar16 = uVar17;
      }
      uVar17 = uVar16;
      lVar13 = lVar13 + 0x28;
    } while (uVar15 * 0x28 != lVar13);
    uVar17 = uVar17 + 1;
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar17);
  iVar19 = (this->Glyphs).Size;
  lVar13 = (long)iVar19;
  if (0 < lVar13) {
    pfVar3 = (this->IndexAdvanceX).Data;
    puVar4 = (this->IndexLookup).Data;
    pfVar14 = &((this->Glyphs).Data)->AdvanceX;
    lVar18 = 0;
    do {
      uVar16 = *(uint *)(pfVar14 + -1);
      *(float *)((long)pfVar3 + (ulong)(uVar16 & 0xfffffffc)) = *pfVar14;
      puVar4[uVar16 >> 2] = (unsigned_short)lVar18;
      this->Used4kPagesMap[uVar16 >> 0x11] =
           this->Used4kPagesMap[uVar16 >> 0x11] | (byte)(1 << ((byte)(uVar16 >> 0xe) & 7));
      lVar18 = lVar18 + 1;
      pfVar14 = pfVar14 + 10;
    } while (lVar13 != lVar18);
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    if (((undefined1  [40])(this->Glyphs).Data[lVar13 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      iVar20 = iVar19 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= iVar19) {
        if (iVar2 == 0) {
          iVar19 = 8;
        }
        else {
          iVar19 = iVar2 / 2 + iVar2;
        }
        if (iVar19 <= iVar20) {
          iVar19 = iVar20;
        }
        if (iVar2 < iVar19) {
          pIVar11 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar19 * 0x28);
          pIVar12 = (this->Glyphs).Data;
          if (pIVar12 != (ImFontGlyph *)0x0) {
            memcpy(pIVar11,pIVar12,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar11;
          (this->Glyphs).Capacity = iVar19;
        }
      }
      (this->Glyphs).Size = iVar20;
    }
    pIVar12 = (this->Glyphs).Data;
    iVar19 = (this->Glyphs).Size;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar11 = this->FallbackGlyph;
    }
    else {
      pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    fVar21 = pIVar11->V1;
    pIVar12[(long)iVar19 + -1].U1 = pIVar11->U1;
    pIVar12[(long)iVar19 + -1].V1 = fVar21;
    uVar7 = *(undefined4 *)&pIVar11->field_0x0;
    fVar8 = pIVar11->AdvanceX;
    fVar9 = pIVar11->X0;
    fVar10 = pIVar11->Y0;
    fVar21 = pIVar11->Y1;
    fVar5 = pIVar11->U0;
    fVar6 = pIVar11->V0;
    pIVar12[(long)iVar19 + -1].X1 = pIVar11->X1;
    pIVar12[(long)iVar19 + -1].Y1 = fVar21;
    pIVar12[(long)iVar19 + -1].U0 = fVar5;
    pIVar12[(long)iVar19 + -1].V0 = fVar6;
    *(undefined4 *)&pIVar12[(long)iVar19 + -1].field_0x0 = uVar7;
    pIVar12[(long)iVar19 + -1].AdvanceX = fVar8;
    pIVar12[(long)iVar19 + -1].X0 = fVar9;
    pIVar12[(long)iVar19 + -1].Y0 = fVar10;
    *(uint *)(pIVar12 + (long)iVar19 + -1) = *(uint *)(pIVar12 + (long)iVar19 + -1) & 3 | 0x24;
    fVar21 = pIVar12[(long)iVar19 + -1].AdvanceX * 4.0;
    pIVar12[(long)iVar19 + -1].AdvanceX = fVar21;
    (this->IndexAdvanceX).Data[9] = fVar21;
    (this->IndexLookup).Data[*(uint *)(pIVar12 + (long)iVar19 + -1) >> 2] =
         (short)(this->Glyphs).Size - 1;
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
  }
  if (((uint)(this->IndexLookup).Size < 10) ||
     (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
  }
  if ((ulong)this->FallbackChar < (ulong)(long)(this->IndexLookup).Size) {
    uVar1 = (this->IndexLookup).Data[this->FallbackChar];
    pIVar12 = (ImFontGlyph *)0x0;
    if (uVar1 != 0xffff) {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
  }
  else {
    pIVar12 = (ImFontGlyph *)0x0;
  }
  this->FallbackGlyph = pIVar12;
  fVar21 = 0.0;
  if (pIVar12 != (ImFontGlyph *)0x0) {
    fVar21 = pIVar12->AdvanceX;
  }
  this->FallbackAdvanceX = fVar21;
  pfVar3 = (this->IndexAdvanceX).Data;
  uVar15 = 0;
  do {
    pfVar14 = pfVar3 + uVar15;
    if (*pfVar14 <= 0.0 && *pfVar14 != 0.0) {
      pfVar3[uVar15] = this->FallbackAdvanceX;
    }
    uVar15 = uVar15 + 1;
  } while (uVar17 != uVar15);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}